

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_MESA_window_pos(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_MESA_window_pos != 0) {
    glad_glWindowPos2dMESA = (PFNGLWINDOWPOS2DMESAPROC)(*load)("glWindowPos2dMESA");
    glad_glWindowPos2dvMESA = (PFNGLWINDOWPOS2DVMESAPROC)(*load)("glWindowPos2dvMESA");
    glad_glWindowPos2fMESA = (PFNGLWINDOWPOS2FMESAPROC)(*load)("glWindowPos2fMESA");
    glad_glWindowPos2fvMESA = (PFNGLWINDOWPOS2FVMESAPROC)(*load)("glWindowPos2fvMESA");
    glad_glWindowPos2iMESA = (PFNGLWINDOWPOS2IMESAPROC)(*load)("glWindowPos2iMESA");
    glad_glWindowPos2ivMESA = (PFNGLWINDOWPOS2IVMESAPROC)(*load)("glWindowPos2ivMESA");
    glad_glWindowPos2sMESA = (PFNGLWINDOWPOS2SMESAPROC)(*load)("glWindowPos2sMESA");
    glad_glWindowPos2svMESA = (PFNGLWINDOWPOS2SVMESAPROC)(*load)("glWindowPos2svMESA");
    glad_glWindowPos3dMESA = (PFNGLWINDOWPOS3DMESAPROC)(*load)("glWindowPos3dMESA");
    glad_glWindowPos3dvMESA = (PFNGLWINDOWPOS3DVMESAPROC)(*load)("glWindowPos3dvMESA");
    glad_glWindowPos3fMESA = (PFNGLWINDOWPOS3FMESAPROC)(*load)("glWindowPos3fMESA");
    glad_glWindowPos3fvMESA = (PFNGLWINDOWPOS3FVMESAPROC)(*load)("glWindowPos3fvMESA");
    glad_glWindowPos3iMESA = (PFNGLWINDOWPOS3IMESAPROC)(*load)("glWindowPos3iMESA");
    glad_glWindowPos3ivMESA = (PFNGLWINDOWPOS3IVMESAPROC)(*load)("glWindowPos3ivMESA");
    glad_glWindowPos3sMESA = (PFNGLWINDOWPOS3SMESAPROC)(*load)("glWindowPos3sMESA");
    glad_glWindowPos3svMESA = (PFNGLWINDOWPOS3SVMESAPROC)(*load)("glWindowPos3svMESA");
    glad_glWindowPos4dMESA = (PFNGLWINDOWPOS4DMESAPROC)(*load)("glWindowPos4dMESA");
    glad_glWindowPos4dvMESA = (PFNGLWINDOWPOS4DVMESAPROC)(*load)("glWindowPos4dvMESA");
    glad_glWindowPos4fMESA = (PFNGLWINDOWPOS4FMESAPROC)(*load)("glWindowPos4fMESA");
    glad_glWindowPos4fvMESA = (PFNGLWINDOWPOS4FVMESAPROC)(*load)("glWindowPos4fvMESA");
    glad_glWindowPos4iMESA = (PFNGLWINDOWPOS4IMESAPROC)(*load)("glWindowPos4iMESA");
    glad_glWindowPos4ivMESA = (PFNGLWINDOWPOS4IVMESAPROC)(*load)("glWindowPos4ivMESA");
    glad_glWindowPos4sMESA = (PFNGLWINDOWPOS4SMESAPROC)(*load)("glWindowPos4sMESA");
    glad_glWindowPos4svMESA = (PFNGLWINDOWPOS4SVMESAPROC)(*load)("glWindowPos4svMESA");
  }
  return;
}

Assistant:

static void load_GL_MESA_window_pos(GLADloadproc load) {
	if(!GLAD_GL_MESA_window_pos) return;
	glad_glWindowPos2dMESA = (PFNGLWINDOWPOS2DMESAPROC)load("glWindowPos2dMESA");
	glad_glWindowPos2dvMESA = (PFNGLWINDOWPOS2DVMESAPROC)load("glWindowPos2dvMESA");
	glad_glWindowPos2fMESA = (PFNGLWINDOWPOS2FMESAPROC)load("glWindowPos2fMESA");
	glad_glWindowPos2fvMESA = (PFNGLWINDOWPOS2FVMESAPROC)load("glWindowPos2fvMESA");
	glad_glWindowPos2iMESA = (PFNGLWINDOWPOS2IMESAPROC)load("glWindowPos2iMESA");
	glad_glWindowPos2ivMESA = (PFNGLWINDOWPOS2IVMESAPROC)load("glWindowPos2ivMESA");
	glad_glWindowPos2sMESA = (PFNGLWINDOWPOS2SMESAPROC)load("glWindowPos2sMESA");
	glad_glWindowPos2svMESA = (PFNGLWINDOWPOS2SVMESAPROC)load("glWindowPos2svMESA");
	glad_glWindowPos3dMESA = (PFNGLWINDOWPOS3DMESAPROC)load("glWindowPos3dMESA");
	glad_glWindowPos3dvMESA = (PFNGLWINDOWPOS3DVMESAPROC)load("glWindowPos3dvMESA");
	glad_glWindowPos3fMESA = (PFNGLWINDOWPOS3FMESAPROC)load("glWindowPos3fMESA");
	glad_glWindowPos3fvMESA = (PFNGLWINDOWPOS3FVMESAPROC)load("glWindowPos3fvMESA");
	glad_glWindowPos3iMESA = (PFNGLWINDOWPOS3IMESAPROC)load("glWindowPos3iMESA");
	glad_glWindowPos3ivMESA = (PFNGLWINDOWPOS3IVMESAPROC)load("glWindowPos3ivMESA");
	glad_glWindowPos3sMESA = (PFNGLWINDOWPOS3SMESAPROC)load("glWindowPos3sMESA");
	glad_glWindowPos3svMESA = (PFNGLWINDOWPOS3SVMESAPROC)load("glWindowPos3svMESA");
	glad_glWindowPos4dMESA = (PFNGLWINDOWPOS4DMESAPROC)load("glWindowPos4dMESA");
	glad_glWindowPos4dvMESA = (PFNGLWINDOWPOS4DVMESAPROC)load("glWindowPos4dvMESA");
	glad_glWindowPos4fMESA = (PFNGLWINDOWPOS4FMESAPROC)load("glWindowPos4fMESA");
	glad_glWindowPos4fvMESA = (PFNGLWINDOWPOS4FVMESAPROC)load("glWindowPos4fvMESA");
	glad_glWindowPos4iMESA = (PFNGLWINDOWPOS4IMESAPROC)load("glWindowPos4iMESA");
	glad_glWindowPos4ivMESA = (PFNGLWINDOWPOS4IVMESAPROC)load("glWindowPos4ivMESA");
	glad_glWindowPos4sMESA = (PFNGLWINDOWPOS4SMESAPROC)load("glWindowPos4sMESA");
	glad_glWindowPos4svMESA = (PFNGLWINDOWPOS4SVMESAPROC)load("glWindowPos4svMESA");
}